

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_lastore(ExecutionEngine *this)

{
  int iVar1;
  ValueType VVar2;
  VMStack *this_00;
  Frame *this_01;
  ostream *poVar3;
  Value value_00;
  Value VVar4;
  Value VVar5;
  ValueType VStack_64;
  Value arrayref;
  Value index;
  Value padding;
  Value value;
  ArrayObject *array;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  value_00 = Frame::popTopOfOperandStack(this_01);
  padding.data.longValue._4_4_ = value_00.type;
  if (padding.data.longValue._4_4_ != 6) {
    __assert_fail("value.type == ValueType::LONG",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x627,"void ExecutionEngine::i_lastore()");
  }
  VVar4 = Frame::popTopOfOperandStack(this_01);
  index.data.longValue._4_4_ = VVar4.type;
  if (index.data.longValue._4_4_ != 10) {
    __assert_fail("padding.type == ValueType::PADDING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x629,"void ExecutionEngine::i_lastore()");
  }
  VVar4 = Frame::popTopOfOperandStack(this_01);
  arrayref.data.longValue._4_4_ = VVar4.type;
  if (arrayref.data.longValue._4_4_ != 4) {
    __assert_fail("index.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x62b,"void ExecutionEngine::i_lastore()");
  }
  VVar5 = Frame::popTopOfOperandStack(this_01);
  VStack_64 = VVar5.type;
  if (VStack_64 == REFERENCE) {
    arrayref._0_8_ = VVar5.data;
    iVar1 = (*(code *)**(undefined8 **)arrayref._0_8_)();
    if (iVar1 != 2) {
      __assert_fail("(arrayref.data.object)->objectType() == ObjectType::ARRAY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0x62e,"void ExecutionEngine::i_lastore()");
    }
    if (arrayref._0_8_ == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"NullPointerException");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    index.printType = VVar4.data._0_4_;
    VVar2 = ArrayObject::getSize((ArrayObject *)arrayref._0_8_);
    if ((index.printType < VVar2) && (-1 < (int)index.printType)) {
      VVar2 = ArrayObject::arrayContentType((ArrayObject *)arrayref._0_8_);
      if (VVar2 == LONG) {
        ArrayObject::changeValueAt((ArrayObject *)arrayref._0_8_,index.printType,value_00);
        this_01->pc = this_01->pc + 1;
        return;
      }
      __assert_fail("value.type == array->arrayContentType()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0x63b,"void ExecutionEngine::i_lastore()");
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"ArrayIndexOutOfBoundsException");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  __assert_fail("arrayref.type == ValueType::REFERENCE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x62d,"void ExecutionEngine::i_lastore()");
}

Assistant:

void ExecutionEngine::i_lastore() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
	ArrayObject *array;

    Value value = topFrame->popTopOfOperandStack();
    assert(value.type == ValueType::LONG);
    Value padding = topFrame->popTopOfOperandStack();
    assert(padding.type == ValueType::PADDING);
    Value index = topFrame->popTopOfOperandStack();
    assert(index.type == ValueType::INT);
    Value arrayref = topFrame->popTopOfOperandStack();
    assert(arrayref.type == ValueType::REFERENCE);
    assert((arrayref.data.object)->objectType() == ObjectType::ARRAY);

    array = (ArrayObject *) arrayref.data.object;

    if (array == NULL) {
        cerr << "NullPointerException" << endl;
        exit(1);
    }
    if (index.data.intValue >= array->getSize() || index.data.intValue < 0) {
        cerr << "ArrayIndexOutOfBoundsException" << endl;
        exit(2);
    }

    assert(value.type == array->arrayContentType());
    array->changeValueAt(index.data.intValue, value);

    topFrame->pc += 1;
}